

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

void __thiscall
__gnu_cxx::new_allocator<cereal::JSONInputArchive::Iterator>::
construct<cereal::JSONInputArchive::Iterator,rapidjson::GenericMemberIterator<false,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::GenericMemberIterator<false,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (new_allocator<cereal::JSONInputArchive::Iterator> *this,Iterator *__p,
          GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *__args,GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *__args_1)

{
  Pointer pVVar1;
  Pointer pVVar2;
  long lVar3;
  
  pVVar1 = __args->ptr_;
  pVVar2 = __args_1->ptr_;
  (__p->itsMemberItBegin).ptr_ = pVVar1;
  (__p->itsMemberItEnd).ptr_ = pVVar2;
  __p->itsIndex = 0;
  lVar3 = (long)pVVar2 - (long)pVVar1;
  __p->itsSize = lVar3 >> 5;
  __p->itsType = (lVar3 == 0) + Member;
  return;
}

Assistant:

GenericMemberIterator(const NonConstIterator & it) : ptr_(it.ptr_) {}